

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaro_impl.hpp
# Opt level: O3

double duckdb_jaro_winkler::detail::jaro_similarity<char_const*,char_const*>
                 (char *P_first,char *P_last,char *T_first,char *T_last,double score_cutoff)

{
  byte bVar1;
  bool bVar2;
  double dVar3;
  uint64_t uVar4;
  long lVar5;
  ulong *puVar6;
  uint64_t *puVar7;
  unsigned_long *puVar8;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  uint64_t uVar17;
  long lVar18;
  uint64_t P_flag;
  ulong uVar19;
  BitvectorHashmap *pBVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  uint64_t T_flag;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  char *first;
  ulong uVar27;
  bool bVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar31;
  double dVar32;
  FlaggedCharsMultiword flagged;
  PatternMatchVector PM;
  ulong local_10c8;
  ulong *local_1098;
  ulong *puStack_1090;
  undefined8 local_1088;
  ulong *puStack_1080;
  ulong *local_1078;
  undefined8 uStack_1070;
  ulong local_1068;
  uint64_t local_1060;
  undefined1 local_1058 [16];
  ulong local_1048;
  long local_1040;
  ulong local_1038;
  PatternMatchVector local_1030;
  
  lVar10 = (long)T_last - (long)T_first;
  lVar5 = (long)P_last - (long)P_first;
  if (lVar5 == 0 || lVar10 == 0) {
    return 0.0;
  }
  lVar18 = lVar5;
  if (lVar10 < lVar5) {
    lVar18 = lVar10;
  }
  dVar31 = (double)lVar5;
  dVar32 = (double)lVar10;
  if (((double)lVar18 / dVar32 + (double)lVar18 / dVar31 + 1.0) / 3.0 < score_cutoff) {
    return 0.0;
  }
  if (lVar10 == 1 && lVar5 == 1) {
    if (*P_first == *T_first) {
      uVar29 = 0;
      uVar30 = 0x3ff00000;
    }
    else {
      uVar29 = 0;
      uVar30 = 0;
    }
    goto LAB_00e928e2;
  }
  if (lVar5 < lVar10) {
    lVar18 = lVar10 / 2 + -1;
    if (lVar10 / 2 + lVar5 + -1 < lVar10) {
      T_last = T_first + lVar18 + lVar5;
      lVar10 = lVar18 + lVar5;
    }
  }
  else {
    lVar18 = lVar5 / 2 + -1;
    if (lVar5 / 2 + lVar10 + -1 < lVar5) {
      P_last = P_first + lVar18 + lVar10;
      lVar5 = lVar18 + lVar10;
    }
  }
  if (lVar10 < lVar5) {
    lVar5 = lVar10;
  }
  lVar21 = 0;
  lVar10 = lVar21;
  if (0 < lVar5) {
    do {
      lVar10 = lVar21;
      if (P_first[lVar21] != T_first[lVar21]) break;
      lVar21 = lVar21 + 1;
      lVar10 = lVar5;
    } while (lVar5 != lVar21);
  }
  first = P_first + lVar10;
  lVar5 = 0;
  local_1058._8_4_ = in_XMM0_Dc;
  local_1058._0_8_ = score_cutoff;
  local_1058._12_4_ = in_XMM0_Dd;
  dVar3 = score_cutoff;
  if ((P_last != first) && (pcVar13 = T_first + lVar10, dVar3 = score_cutoff, T_last != pcVar13)) {
    uVar24 = (long)P_last - (long)first;
    uVar14 = (long)T_last - (long)pcVar13;
    if (((long)uVar24 < 0x41) && ((long)uVar14 < 0x41)) {
      uVar25 = 0;
      switchD_01043a80::default(&local_1030,0,0x1000);
      common::PatternMatchVector::insert<char_const*>(&local_1030,first,P_last);
      iVar12 = (int)lVar18;
      uVar24 = ~(-1L << ((char)lVar18 + 1U & 0x3f));
      if (0x3e < iVar12) {
        uVar24 = 0xffffffffffffffff;
      }
      uVar27 = (long)iVar12;
      if ((long)uVar14 < (long)iVar12) {
        uVar27 = uVar14;
      }
      if ((long)uVar27 < 1) {
        uVar27 = 0;
        uVar19 = 0;
      }
      else {
        uVar19 = 0;
        uVar25 = 0;
        uVar22 = 0;
        do {
          uVar17 = (uint64_t)pcVar13[uVar22];
          if ((long)uVar17 < 0) {
            uVar17 = common::BitvectorHashmap::lookup(&local_1030.m_map,uVar17);
            puVar8 = &local_1030.m_map.m_map._M_elems[uVar17].value;
          }
          else {
            puVar8 = local_1030.m_extendedAscii._M_elems + uVar17;
          }
          uVar11 = ~uVar19 & *puVar8 & uVar24;
          uVar19 = uVar19 | -uVar11 & uVar11;
          uVar25 = uVar25 | (ulong)(uVar11 != 0) << ((byte)uVar22 & 0x3f);
          uVar24 = uVar24 * 2 + 1;
          uVar22 = uVar22 + 1;
        } while (uVar27 != uVar22);
      }
      if ((long)uVar27 < (long)uVar14) {
        do {
          uVar17 = (uint64_t)pcVar13[uVar27];
          if ((long)uVar17 < 0) {
            uVar17 = common::BitvectorHashmap::lookup(&local_1030.m_map,uVar17);
            puVar8 = &local_1030.m_map.m_map._M_elems[uVar17].value;
          }
          else {
            puVar8 = local_1030.m_extendedAscii._M_elems + uVar17;
          }
          uVar22 = ~uVar19 & *puVar8 & uVar24;
          uVar19 = uVar19 | -uVar22 & uVar22;
          uVar25 = uVar25 | (ulong)(uVar22 != 0) << ((byte)uVar27 & 0x3f);
          uVar24 = uVar24 * 2;
          uVar27 = uVar27 + 1;
        } while ((long)uVar27 < (long)uVar14);
      }
      uVar14 = uVar19 - (uVar19 >> 1 & 0x5555555555555555);
      uVar14 = (uVar14 >> 2 & 0x3333333333333333) + (uVar14 & 0x3333333333333333);
      lVar10 = lVar10 + (((uVar14 >> 4) + uVar14 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
      if (lVar10 == 0) {
        return 0.0;
      }
      if (((double)lVar10 / dVar32 + (double)lVar10 / dVar31 + 0.0 + 1.0) / 3.0 <
          (double)local_1058._0_8_) {
        return 0.0;
      }
      if (uVar25 == 0) {
        lVar5 = 0;
        dVar3 = (double)local_1058._0_8_;
      }
      else {
        lVar5 = 0;
        do {
          lVar18 = 0;
          if (uVar25 != 0) {
            for (; (uVar25 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
            }
          }
          uVar17 = (uint64_t)pcVar13[lVar18];
          if ((long)uVar17 < 0) {
            uVar17 = common::BitvectorHashmap::lookup(&local_1030.m_map,uVar17);
            puVar8 = &local_1030.m_map.m_map._M_elems[uVar17].value;
          }
          else {
            puVar8 = local_1030.m_extendedAscii._M_elems + uVar17;
          }
          lVar5 = lVar5 + (ulong)((*puVar8 & -uVar19 & uVar19) == 0);
          uVar19 = uVar19 ^ -uVar19 & uVar19;
          uVar25 = uVar25 & uVar25 - 1;
          dVar3 = (double)local_1058._0_8_;
        } while (uVar25 != 0);
      }
    }
    else {
      common::BlockPatternMatchVector::BlockPatternMatchVector<char_const*>
                ((BlockPatternMatchVector *)&local_1030,first,P_last);
      uVar25 = uVar14 + 0x3f;
      if (-1 < (long)uVar14) {
        uVar25 = uVar14;
      }
      local_1078 = (ulong *)0x0;
      uStack_1070 = 0;
      local_1088 = 0;
      puStack_1080 = (ulong *)0x0;
      local_1098 = (ulong *)0x0;
      puStack_1090 = (ulong *)0x0;
      duckdb::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&puStack_1080,
                 (((long)uVar25 >> 6) + 1) - (ulong)((uVar14 & 0x3f) == 0));
      uVar25 = uVar24 + 0x3f;
      if (-1 < (long)uVar24) {
        uVar25 = uVar24;
      }
      duckdb::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1098,
                 (((long)uVar25 >> 6) + 1) - (ulong)((uVar24 & 0x3f) == 0));
      if (0 < (long)uVar14) {
        uVar25 = lVar18 + 1U;
        if ((long)uVar24 < (long)(lVar18 + 1U)) {
          uVar25 = uVar24;
        }
        uVar27 = 0xffffffffffffffff;
        local_10c8 = ~(-1L << ((byte)uVar25 & 0x3f));
        uVar19 = uVar25 + 0x3f;
        if (-1 < (long)uVar25) {
          uVar19 = uVar25;
        }
        lVar5 = ((long)uVar19 >> 6) + 1;
        uVar25 = 0;
        lVar21 = 0;
        local_1048 = uVar24;
        do {
          bVar1 = pcVar13[uVar25];
          local_1060 = (uint64_t)(char)bVar1;
          uVar19 = (ulong)bVar1;
          uVar24 = uVar25 >> 6;
          bVar9 = (byte)uVar25 & 0x3f;
          local_1038 = uVar25;
          if (lVar5 == 1) {
            if ((char)bVar1 < '\0') {
              pBVar20 = (BitvectorHashmap *)
                        (local_1030.m_map.m_map._M_elems[0].key + lVar21 * 0x800);
              uVar17 = common::BitvectorHashmap::lookup(pBVar20,(long)(char)bVar1);
              puVar7 = &(pBVar20->m_map)._M_elems[uVar17].value;
            }
            else {
              puVar7 = (uint64_t *)
                       (local_1030.m_map.m_map._M_elems[1].value +
                       (uVar19 * local_1030.m_map.m_map._M_elems[3].key + lVar21) * 8);
            }
            uVar25 = *puVar7 & uVar27 & local_10c8;
            uVar19 = ~local_1098[lVar21] & uVar25;
            local_1098[lVar21] = -uVar19 & uVar25 | local_1098[lVar21];
            puStack_1080[uVar24] = puStack_1080[uVar24] | (ulong)(uVar19 != 0) << bVar9;
          }
          else {
            lVar16 = lVar21;
            local_1068 = uVar19;
            if (uVar27 != 0) {
              if ((char)bVar1 < '\0') {
                pBVar20 = (BitvectorHashmap *)
                          (local_1030.m_map.m_map._M_elems[0].key + lVar21 * 0x800);
                uVar17 = common::BitvectorHashmap::lookup(pBVar20,(long)(char)bVar1);
                puVar7 = &(pBVar20->m_map)._M_elems[uVar17].value;
              }
              else {
                puVar7 = (uint64_t *)
                         (local_1030.m_map.m_map._M_elems[1].value +
                         (local_1030.m_map.m_map._M_elems[3].key * uVar19 + lVar21) * 8);
              }
              uVar25 = ~local_1098[lVar21] & *puVar7 & uVar27;
              if (uVar25 != 0) {
                local_1098[lVar21] = -uVar25 & uVar25 | local_1098[lVar21];
                puStack_1080[uVar24] = puStack_1080[uVar24] | 1L << bVar9;
                goto LAB_00e924a2;
              }
              lVar16 = lVar21 + 1;
            }
            lVar26 = lVar5 + lVar21 + -1;
            uVar25 = local_1068;
            if (lVar16 < lVar26) {
              lVar15 = lVar16 * 8;
              lVar23 = lVar16 << 0xb;
              uVar17 = local_1060;
              local_1040 = lVar5;
              do {
                uVar4 = local_1030.m_map.m_map._M_elems[0].key;
                if ((char)uVar17 < '\0') {
                  uVar17 = common::BitvectorHashmap::lookup
                                     ((BitvectorHashmap *)
                                      (local_1030.m_map.m_map._M_elems[0].key + lVar23),uVar17);
                  puVar6 = (ulong *)(uVar4 + uVar17 * 0x10 + lVar16 * 0x800 + 8);
                  uVar17 = local_1060;
                  uVar25 = local_1068;
                  lVar5 = local_1040;
                }
                else {
                  puVar6 = (ulong *)(local_1030.m_map.m_map._M_elems[1].value +
                                    lVar15 + local_1030.m_map.m_map._M_elems[3].key * uVar25 * 8);
                }
                uVar19 = ~*(ulong *)((long)local_1098 + lVar15) & *puVar6;
                if (uVar19 != 0) {
                  *(ulong *)((long)local_1098 + lVar15) =
                       *puVar6 & -uVar19 | *(ulong *)((long)local_1098 + lVar15);
                  puStack_1080[uVar24] = puStack_1080[uVar24] | 1L << bVar9;
                  goto LAB_00e924a2;
                }
                lVar16 = lVar16 + 1;
                lVar15 = lVar15 + 8;
                lVar23 = lVar23 + 0x800;
              } while (lVar16 < lVar26);
            }
            if (local_10c8 != 0) {
              if ((char)uVar25 < '\0') {
                pBVar20 = (BitvectorHashmap *)
                          (local_1030.m_map.m_map._M_elems[0].key + lVar16 * 0x800);
                uVar17 = common::BitvectorHashmap::lookup(pBVar20,(long)(char)uVar25);
                puVar7 = &(pBVar20->m_map)._M_elems[uVar17].value;
              }
              else {
                puVar7 = (uint64_t *)
                         (local_1030.m_map.m_map._M_elems[1].value +
                         (uVar25 * local_1030.m_map.m_map._M_elems[3].key + lVar16) * 8);
              }
              uVar25 = ~local_1098[lVar16] & *puVar7 & local_10c8;
              local_1098[lVar16] = -uVar25 & uVar25 | local_1098[lVar16];
              puStack_1080[uVar24] = puStack_1080[uVar24] | (ulong)(uVar25 != 0) << bVar9;
            }
          }
LAB_00e924a2:
          if ((long)(local_1038 + lVar18 + 1) < (long)local_1048) {
            lVar16 = local_10c8 * 2;
            bVar2 = (long)(local_1038 + lVar18 + 2) < (long)local_1048;
            bVar28 = (local_10c8 & 0x7fffffffffffffff) == 0x7fffffffffffffff;
            local_10c8 = 0;
            if (!bVar28 || !bVar2) {
              local_10c8 = lVar16 + 1;
            }
            lVar5 = lVar5 + (ulong)(bVar28 && bVar2);
          }
          if ((lVar18 <= (long)local_1038) && (uVar27 = uVar27 * 2, uVar27 == 0)) {
            lVar5 = lVar5 + -1;
            lVar21 = lVar21 + 1;
            uVar27 = 0xffffffffffffffff;
          }
          uVar25 = local_1038 + 1;
        } while (uVar25 != uVar14);
      }
      if ((ulong)((long)puStack_1090 - (long)local_1098) <
          (ulong)((long)local_1078 - (long)puStack_1080)) {
        if (local_1098 == puStack_1090) {
LAB_00e927db:
          lVar18 = 0;
        }
        else {
          lVar18 = 0;
          puVar6 = local_1098;
          do {
            uVar14 = *puVar6 - (*puVar6 >> 1 & 0x5555555555555555);
            uVar14 = (uVar14 >> 2 & 0x3333333333333333) + (uVar14 & 0x3333333333333333);
            lVar18 = lVar18 + (((uVar14 >> 4) + uVar14 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                              0x38);
            puVar6 = puVar6 + 1;
          } while (puVar6 != puStack_1090);
        }
      }
      else {
        if (puStack_1080 == local_1078) goto LAB_00e927db;
        lVar18 = 0;
        puVar6 = puStack_1080;
        do {
          uVar14 = *puVar6 - (*puVar6 >> 1 & 0x5555555555555555);
          uVar14 = (uVar14 >> 2 & 0x3333333333333333) + (uVar14 & 0x3333333333333333);
          lVar18 = lVar18 + (((uVar14 >> 4) + uVar14 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                            0x38);
          puVar6 = puVar6 + 1;
        } while (puVar6 != local_1078);
      }
      lVar10 = lVar10 + lVar18;
      if ((lVar10 == 0) ||
         (((double)lVar10 / dVar32 + (double)lVar10 / dVar31 + 0.0 + 1.0) / 3.0 <
          (double)local_1058._0_8_)) {
        bVar2 = false;
LAB_00e92833:
        lVar5 = 0;
      }
      else {
        bVar2 = true;
        if (lVar18 == 0) goto LAB_00e92833;
        uVar24 = *local_1098;
        uVar14 = *puStack_1080;
        lVar5 = 0;
        lVar16 = 0;
        lVar21 = 0;
        do {
          while (uVar14 == 0) {
            pcVar13 = pcVar13 + 0x40;
            lVar26 = lVar21 + 1;
            lVar21 = lVar21 + 1;
            uVar14 = *(ulong *)((long)puStack_1080 + lVar26 * 8);
          }
          do {
            while (uVar24 == 0) {
              lVar26 = lVar16 + 1;
              lVar16 = lVar16 + 1;
              uVar24 = *(ulong *)((long)local_1098 + lVar26 * 8);
            }
            lVar26 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
              }
            }
            uVar17 = (uint64_t)pcVar13[lVar26];
            if ((long)uVar17 < 0) {
              pBVar20 = (BitvectorHashmap *)
                        (local_1030.m_map.m_map._M_elems[0].key + lVar16 * 0x800);
              uVar17 = common::BitvectorHashmap::lookup(pBVar20,uVar17);
              puVar7 = &(pBVar20->m_map)._M_elems[uVar17].value;
            }
            else {
              puVar7 = (uint64_t *)
                       (local_1030.m_map.m_map._M_elems[1].value +
                       (uVar17 * local_1030.m_map.m_map._M_elems[3].key + lVar16) * 8);
            }
            lVar5 = lVar5 + (ulong)((*puVar7 & -uVar24 & uVar24) == 0);
            uVar24 = -uVar24 & uVar24 ^ uVar24;
            lVar18 = lVar18 + -1;
            uVar14 = uVar14 & uVar14 - 1;
          } while (uVar14 != 0);
          uVar14 = 0;
        } while (lVar18 != 0);
        bVar2 = true;
      }
      if (puStack_1080 != (ulong *)0x0) {
        operator_delete(puStack_1080);
      }
      if (local_1098 != (ulong *)0x0) {
        operator_delete(local_1098);
      }
      if ((void *)local_1030.m_map.m_map._M_elems[1].value != (void *)0x0) {
        operator_delete((void *)local_1030.m_map.m_map._M_elems[1].value);
      }
      if ((void *)local_1030.m_map.m_map._M_elems[0].key != (void *)0x0) {
        operator_delete((void *)local_1030.m_map.m_map._M_elems[0].key);
      }
      dVar3 = (double)local_1058._0_8_;
      if (!bVar2) {
        return 0.0;
      }
    }
  }
  local_1058._0_8_ = dVar3;
  dVar3 = (double)lVar10;
  dVar31 = ((dVar3 - (double)(lVar5 / 2)) / dVar3 + dVar3 / dVar32 + dVar3 / dVar31 + 0.0) / 3.0;
  uVar14 = -(ulong)((double)local_1058._0_8_ <= dVar31) & (ulong)dVar31;
  uVar29 = (undefined4)uVar14;
  uVar30 = (undefined4)(uVar14 >> 0x20);
LAB_00e928e2:
  return (double)CONCAT44(uVar30,uVar29);
}

Assistant:

double jaro_similarity(InputIt1 P_first, InputIt1 P_last, InputIt2 T_first, InputIt2 T_last,
                       double score_cutoff)
{
    int64_t P_len = std::distance(P_first, P_last);
    int64_t T_len = std::distance(T_first, T_last);

    /* filter out based on the length difference between the two strings */
    if (!jaro_length_filter(P_len, T_len, score_cutoff)) {
        return 0.0;
    }

    if (P_len == 1 && T_len == 1) {
        return static_cast<double>(P_first[0] == T_first[0]);
    }

    int64_t Bound = jaro_bounds(P_first, P_last, T_first, T_last);

    /* common prefix never includes Transpositions */
    int64_t CommonChars = common::remove_common_prefix(P_first, P_last, T_first, T_last);
    int64_t Transpositions = 0;
    int64_t P_view_len = std::distance(P_first, P_last);
    int64_t T_view_len = std::distance(T_first, T_last);

    if (!P_view_len || !T_view_len) {
        /* already has correct number of common chars and transpositions */
    }
    else if (P_view_len <= 64 && T_view_len <= 64) {
        common::PatternMatchVector PM(P_first, P_last);
        auto flagged = flag_similar_characters_word(PM, P_first, P_last, T_first, T_last, static_cast<int>(Bound));
        CommonChars += count_common_chars(flagged);

        if (!jaro_common_char_filter(P_len, T_len, CommonChars, score_cutoff)) {
            return 0.0;
        }

        Transpositions = count_transpositions_word(PM, T_first, T_last, flagged);
    }
    else {
        common::BlockPatternMatchVector PM(P_first, P_last);
        auto flagged = flag_similar_characters_block(PM, P_first, P_last, T_first, T_last, Bound);
        int64_t FlaggedChars = count_common_chars(flagged);
        CommonChars += FlaggedChars;

        if (!jaro_common_char_filter(P_len, T_len, CommonChars, score_cutoff)) {
            return 0.0;
        }

        Transpositions = count_transpositions_block(PM, T_first, T_last, flagged, FlaggedChars);
    }

    double Sim = jaro_calculate_similarity(P_len, T_len, CommonChars, Transpositions);
    return common::result_cutoff(Sim, score_cutoff);
}